

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::readI<(moira::Size)1>(Moira *this)

{
  undefined2 uVar1;
  long in_RDI;
  Moira *unaff_retaddr;
  u32 result;
  
  uVar1 = *(undefined2 *)(in_RDI + 0x5cec);
  readExt(unaff_retaddr);
  return (uint)(byte)uVar1;
}

Assistant:

u32
Moira::readI()
{
    u32 result;

    switch (S) {
        case Byte:
            result = (u8)queue.irc;
            readExt();
            break;
        case Word:
            result = queue.irc;
            readExt();
            break;
        case Long:
            result = queue.irc << 16;
            readExt();
            result |= queue.irc;
            readExt();
            break;
    }

    return result;
}